

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNSym::gen_code_new
          (CTPNSym *this,int discard,int argc,int varargs,CTcNamedArgs *named_args,int param_6,
          int is_transient)

{
  CTcPrsSymtab *sym;
  CTcPrsSymtab *this_00;
  CTcSymbol *pCVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  uint in_stack_00000008;
  int in_stack_ffffffffffffffbc;
  
  sym = CTcCodeStream::get_symtab(G_cs);
  this_00 = (CTcPrsSymtab *)(**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RDI + 0x68))();
  pCVar1 = CTcPrsSymtab::find_or_def_undef
                     (this_00,(char *)sym,(size_t)in_RDI,in_stack_ffffffffffffffbc);
  (*(pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x1c])
            (pCVar1,(ulong)in_ESI,(ulong)in_EDX,(ulong)in_ECX,in_R8,(ulong)in_stack_00000008);
  return;
}

Assistant:

void CTPNSym::gen_code_new(int discard, int argc, int varargs,
                           CTcNamedArgs *named_args,
                           int /*from_call*/, int is_transient)
{
    /*
     *   Look up our symbol, then ask the resulting symbol to generate the
     *   'new' code.  If the symbol is undefined, add an 'undefined' entry
     *   to the table; we can't implicitly create an object symbol. 
     */
    G_cs->get_symtab()
        ->find_or_def_undef(get_sym_text(), get_sym_text_len(), FALSE)
        ->gen_code_new(discard, argc, varargs, named_args, is_transient);
}